

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

void covenant::remove<std::vector<covenant::Sym,std::allocator<covenant::Sym>>>
               (vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                *vec,size_t pos)

{
  size_type sVar1;
  ulong in_RSI;
  vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  *in_RDI;
  undefined1 uVar2;
  iterator it;
  vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  __normal_iterator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_*,_std::vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  sVar1 = std::
          vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
          ::size(in_RDI);
  uVar2 = in_RSI < sVar1;
  if (!(bool)uVar2) {
    __assert_fail("pos < vec.size() && \"Out-of-bounds access\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/Common.h"
                  ,0x7c,
                  "void covenant::remove(vector<T> &, size_t) [T = std::vector<covenant::Sym>]");
  }
  std::
  vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ::begin(in_stack_ffffffffffffffb8);
  std::
  advance<__gnu_cxx::__normal_iterator<std::vector<covenant::Sym,std::allocator<covenant::Sym>>*,std::vector<std::vector<covenant::Sym,std::allocator<covenant::Sym>>,std::allocator<std::vector<covenant::Sym,std::allocator<covenant::Sym>>>>>,unsigned_long>
            (in_stack_ffffffffffffffe0,(unsigned_long)in_stack_ffffffffffffffd8._M_current);
  __gnu_cxx::
  __normal_iterator<std::vector<covenant::Sym,std::allocator<covenant::Sym>>const*,std::vector<std::vector<covenant::Sym,std::allocator<covenant::Sym>>,std::allocator<std::vector<covenant::Sym,std::allocator<covenant::Sym>>>>>
  ::__normal_iterator<std::vector<covenant::Sym,std::allocator<covenant::Sym>>*>
            ((__normal_iterator<const_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_*,_std::vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>_>
              *)in_RDI,
             (__normal_iterator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_*,_std::vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>_>
              *)in_stack_ffffffffffffffb8);
  std::
  vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ::erase((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
           *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void remove(vector<T>& vec, size_t pos)
  {
    assert(pos < vec.size() && "Out-of-bounds access");
    typename vector<T>::iterator it = vec.begin();
    advance(it, pos);
    vec.erase(it);
  }